

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O0

void MULTICLASS::print_label_pred(vw *all,example *ec,uint32_t prediction)

{
  ulong uVar1;
  undefined4 in_EDX;
  shared_data *in_RSI;
  bool bVar2;
  substring sVar3;
  substring sVar4;
  substring ss_pred;
  substring ss_label;
  uint32_t in_stack_ffffffffffffff0c;
  namedlabels *in_stack_ffffffffffffff10;
  char *pcVar5;
  allocator local_93;
  byte local_92;
  allocator local_91;
  string local_90 [34];
  byte local_6e;
  allocator local_6d [19];
  byte local_5a;
  allocator local_59;
  string local_58 [24];
  float in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  char *pcVar6;
  undefined1 holdout_set_off;
  
  holdout_set_off = (undefined1)((uint)in_EDX >> 0x18);
  sVar3 = namedlabels::get(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  sVar4 = namedlabels::get(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  pcVar5 = sVar3.begin;
  local_5a = 0;
  local_6e = 0;
  if (pcVar5 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_5a = 1;
    std::__cxx11::string::string(local_58,"unknown",&local_59);
  }
  else {
    pcVar6 = sVar3.end;
    std::allocator<char>::allocator();
    local_6e = 1;
    std::__cxx11::string::string(local_58,pcVar5,(long)pcVar6 - (long)pcVar5,local_6d);
  }
  pcVar5 = sVar4.begin;
  local_92 = 0;
  bVar2 = pcVar5 != (char *)0x0;
  if (bVar2) {
    uVar1 = (long)sVar4.end - (long)pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar5,uVar1,&local_93);
  }
  else {
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string(local_90,"unknown",&local_91);
  }
  shared_data::print_update
            (in_RSI,(bool)holdout_set_off,(size_t)sVar3.end,(string *)sVar3.begin,
             (string *)sVar4.end,(size_t)sVar4.begin,(bool)in_stack_ffffffffffffffc7,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_90);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_93);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  std::__cxx11::string::~string(local_58);
  if ((local_6e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_6d);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void print_label_pred(vw& all, example& ec, uint32_t prediction)
{
  substring ss_label = all.sd->ldict->get(ec.l.multi.label);
  substring ss_pred = all.sd->ldict->get(prediction);
  all.sd->print_update(all.holdout_set_off, all.current_pass,
      !ss_label.begin ? "unknown" : string(ss_label.begin, ss_label.end - ss_label.begin),
      !ss_pred.begin ? "unknown" : string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.num_features,
      all.progress_add, all.progress_arg);
}